

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O1

string * __thiscall
pbrt::FresnelDielectric::ToString_abi_cxx11_(string *__return_storage_ptr__,FresnelDielectric *this)

{
  char *local_20;
  
  local_20 = "false";
  if (this[4] != (FresnelDielectric)0x0) {
    local_20 = "true";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,char_const*>
            (__return_storage_ptr__,"[ FrenselDielectric eta: %f opaque: %s ]",(float *)this,
             &local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string FresnelDielectric::ToString() const {
    return StringPrintf("[ FrenselDielectric eta: %f opaque: %s ]", eta,
                        opaque ? "true" : "false");
}